

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::genSortFunction_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,size_t *rel_id)

{
  pointer pcVar1;
  long lVar2;
  string *psVar3;
  long *plVar4;
  undefined8 *puVar5;
  Attribute *pAVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  ulong uVar10;
  ulong uVar11;
  char cVar12;
  ushort uVar13;
  byte bVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  byte bVar28;
  char cVar29;
  byte bVar30;
  char cVar31;
  byte bVar32;
  undefined1 auVar22 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  string relName;
  string returnString;
  string sortAlgo;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  ulong *local_228;
  long local_220;
  ulong local_218;
  undefined8 uStack_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  long lStack_1f0;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  undefined8 uStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ulong *local_188;
  long local_180;
  ulong local_178;
  long lStack_170;
  ulong *local_168;
  long local_160;
  ulong local_158;
  long lStack_150;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string *local_48;
  size_t *local_40;
  TDNode *local_38;
  undefined4 uVar14;
  undefined6 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  
  local_40 = rel_id;
  local_38 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        *rel_id);
  local_e8[0] = local_d8;
  pcVar1 = (local_38->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,pcVar1,pcVar1 + (local_38->_name)._M_string_length);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"std::sort(","");
  local_1e8 = &local_1d8;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x03');
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_1a8 = &local_198;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_198 = *plVar7;
    lStack_190 = plVar4[3];
  }
  else {
    local_198 = *plVar7;
    local_1a8 = (long *)*plVar4;
  }
  local_1a0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_e8[0]);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_1f8 = *puVar8;
    lStack_1f0 = plVar4[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar8;
    local_208 = (ulong *)*plVar4;
  }
  local_200 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_218 = *puVar8;
    uStack_210 = puVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *puVar8;
    local_228 = (ulong *)*puVar5;
  }
  local_220 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,'\x03');
  uVar11 = 0xf;
  if (local_228 != &local_218) {
    uVar11 = local_218;
  }
  if (uVar11 < (ulong)(local_1c0 + local_220)) {
    uVar11 = 0xf;
    if (local_1c8 != &local_1b8) {
      uVar11 = local_1b8;
    }
    if (uVar11 < (ulong)(local_1c0 + local_220)) goto LAB_00222b59;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_228);
  }
  else {
LAB_00222b59:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1c8);
  }
  local_248 = &local_238;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_238 = *plVar4;
    lStack_230 = puVar5[3];
  }
  else {
    local_238 = *plVar4;
    local_248 = (long *)*puVar5;
  }
  local_240 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_a8 = &local_98;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_98 = *plVar7;
    lStack_90 = plVar4[3];
  }
  else {
    local_98 = *plVar7;
    local_a8 = (long *)*plVar4;
  }
  local_a0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (multifaq::cppgen::BENCH_INDIVIDUAL == '\x01') {
    local_208 = &local_1f8;
    std::__cxx11::string::_M_construct((ulong)&local_208,'\x06');
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_218 = *puVar8;
      uStack_210 = puVar5[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *puVar8;
      local_228 = (ulong *)*puVar5;
    }
    local_220 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
    local_248 = &local_238;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_238 = *plVar4;
      lStack_230 = puVar5[3];
    }
    else {
      local_238 = *plVar4;
      local_248 = (long *)*puVar5;
    }
    local_240 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_248);
    if (local_248 != &local_238) {
      operator_delete(local_248);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208);
    }
  }
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct((ulong)local_88,'\x06');
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_88,(ulong)local_68[0]);
  local_128 = &local_118;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_118 = *plVar7;
    lStack_110 = plVar4[3];
  }
  else {
    local_118 = *plVar7;
    local_128 = (long *)*plVar4;
  }
  local_120 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_e8[0]);
  local_188 = &local_178;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_178 = *puVar8;
    lStack_170 = plVar4[3];
  }
  else {
    local_178 = *puVar8;
    local_188 = (ulong *)*plVar4;
  }
  local_180 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_108 = &local_f8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_f8 = *plVar7;
    lStack_f0 = plVar4[3];
  }
  else {
    local_f8 = *plVar7;
    local_108 = (long *)*plVar4;
  }
  local_100 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_e8[0]);
  local_148 = &local_138;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_138 = *plVar7;
    lStack_130 = plVar4[3];
  }
  else {
    local_138 = *plVar7;
    local_148 = (long *)*plVar4;
  }
  local_140 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_148);
  local_168 = &local_158;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_158 = *puVar8;
    lStack_150 = plVar4[3];
  }
  else {
    local_158 = *puVar8;
    local_168 = (ulong *)*plVar4;
  }
  local_160 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_e8[0]);
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_1b8 = *puVar8;
    uStack_1b0 = puVar5[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar8;
    local_1c8 = (ulong *)*puVar5;
  }
  local_1c0 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_1d8 = *puVar8;
    lStack_1d0 = plVar4[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *puVar8;
    local_1e8 = (ulong *)*plVar4;
  }
  local_1e0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_e8[0]);
  local_1a8 = &local_198;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_198 = *plVar7;
    lStack_190 = plVar4[3];
  }
  else {
    local_198 = *plVar7;
    local_1a8 = (long *)*plVar4;
  }
  local_1a0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_1f8 = *puVar8;
    lStack_1f0 = plVar4[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar8;
    local_208 = (ulong *)*plVar4;
  }
  local_200 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_c8 = local_b8;
  local_48 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_c8,'\x06');
  uVar11 = 0xf;
  if (local_208 != &local_1f8) {
    uVar11 = local_1f8;
  }
  if (uVar11 < (ulong)(local_c0 + local_200)) {
    uVar11 = 0xf;
    if (local_c8 != local_b8) {
      uVar11 = local_b8[0];
    }
    if (uVar11 < (ulong)(local_c0 + local_200)) goto LAB_002231d2;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_208);
  }
  else {
LAB_002231d2:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_c8);
  }
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_218 = *puVar8;
    uStack_210 = puVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *puVar8;
    local_228 = (ulong *)*puVar5;
  }
  local_220 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_248 = &local_238;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_238 = *plVar7;
    lStack_230 = plVar4[3];
  }
  else {
    local_238 = *plVar7;
    local_248 = (long *)*plVar4;
  }
  local_240 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_248);
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  uVar11 = 0;
  while( true ) {
    auVar22 = *(undefined1 (*) [16])(local_38->_bag).super__Base_bitset<2UL>._M_w;
    auVar33._0_2_ = auVar22._0_2_ >> 1;
    auVar33._2_2_ = auVar22._2_2_ >> 1;
    auVar33._4_2_ = auVar22._4_2_ >> 1;
    auVar33._6_2_ = auVar22._6_2_ >> 1;
    auVar33._8_2_ = auVar22._8_2_ >> 1;
    auVar33._10_2_ = auVar22._10_2_ >> 1;
    auVar33._12_2_ = auVar22._12_2_ >> 1;
    auVar33._14_2_ = auVar22._14_2_ >> 1;
    auVar33 = auVar33 & _DAT_002b0050;
    uVar13 = CONCAT11(auVar22[1] - auVar33[1],auVar22[0] - auVar33[0]);
    uVar14 = CONCAT13(auVar22[3] - auVar33[3],CONCAT12(auVar22[2] - auVar33[2],uVar13));
    uVar15 = CONCAT15(auVar22[5] - auVar33[5],CONCAT14(auVar22[4] - auVar33[4],uVar14));
    uVar16 = CONCAT17(auVar22[7] - auVar33[7],CONCAT16(auVar22[6] - auVar33[6],uVar15));
    auVar17._0_10_ = CONCAT19(auVar22[9] - auVar33[9],CONCAT18(auVar22[8] - auVar33[8],uVar16));
    auVar17[10] = auVar22[10] - auVar33[10];
    auVar17[0xb] = auVar22[0xb] - auVar33[0xb];
    auVar19[0xc] = auVar22[0xc] - auVar33[0xc];
    auVar19._0_12_ = auVar17;
    auVar19[0xd] = auVar22[0xd] - auVar33[0xd];
    auVar21[0xe] = auVar22[0xe] - auVar33[0xe];
    auVar21._0_14_ = auVar19;
    auVar21[0xf] = auVar22[0xf] - auVar33[0xf];
    auVar33 = auVar21 & _DAT_002b0060;
    auVar22._0_2_ = uVar13 >> 2;
    auVar22._2_2_ = (ushort)((uint)uVar14 >> 0x12);
    auVar22._4_2_ = (ushort)((uint6)uVar15 >> 0x22);
    auVar22._6_2_ = (ushort)((ulong)uVar16 >> 0x32);
    auVar22._8_2_ = (ushort)((unkuint10)auVar17._0_10_ >> 0x42);
    auVar22._10_2_ = auVar17._10_2_ >> 2;
    auVar22._12_2_ = auVar19._12_2_ >> 2;
    auVar22._14_2_ = auVar21._14_2_ >> 2;
    auVar22 = auVar22 & _DAT_002b0060;
    cVar12 = auVar22[0] + auVar33[0];
    bVar24 = auVar22[1] + auVar33[1];
    uVar13 = CONCAT11(bVar24,cVar12);
    cVar25 = auVar22[2] + auVar33[2];
    bVar26 = auVar22[3] + auVar33[3];
    uVar14 = CONCAT13(bVar26,CONCAT12(cVar25,uVar13));
    cVar27 = auVar22[4] + auVar33[4];
    bVar28 = auVar22[5] + auVar33[5];
    uVar15 = CONCAT15(bVar28,CONCAT14(cVar27,uVar14));
    cVar29 = auVar22[6] + auVar33[6];
    bVar30 = auVar22[7] + auVar33[7];
    uVar16 = CONCAT17(bVar30,CONCAT16(cVar29,uVar15));
    cVar31 = auVar22[8] + auVar33[8];
    bVar32 = auVar22[9] + auVar33[9];
    auVar18._0_10_ = CONCAT19(bVar32,CONCAT18(cVar31,uVar16));
    auVar18[10] = auVar22[10] + auVar33[10];
    auVar18[0xb] = auVar22[0xb] + auVar33[0xb];
    auVar20[0xc] = auVar22[0xc] + auVar33[0xc];
    auVar20._0_12_ = auVar18;
    auVar20[0xd] = auVar22[0xd] + auVar33[0xd];
    auVar23[0xe] = auVar22[0xe] + auVar33[0xe];
    auVar23._0_14_ = auVar20;
    auVar23[0xf] = auVar22[0xf] + auVar33[0xf];
    auVar34[0] = (char)(uVar13 >> 4) + cVar12;
    auVar34[1] = (bVar24 >> 4) + bVar24;
    auVar34[2] = (char)(ushort)((uint)uVar14 >> 0x14) + cVar25;
    auVar34[3] = (bVar26 >> 4) + bVar26;
    auVar34[4] = (char)(ushort)((uint6)uVar15 >> 0x24) + cVar27;
    auVar34[5] = (bVar28 >> 4) + bVar28;
    auVar34[6] = (char)(ushort)((ulong)uVar16 >> 0x34) + cVar29;
    auVar34[7] = (bVar30 >> 4) + bVar30;
    auVar34[8] = (char)(ushort)((unkuint10)auVar18._0_10_ >> 0x44) + cVar31;
    auVar34[9] = (bVar32 >> 4) + bVar32;
    auVar34[10] = (char)(auVar18._10_2_ >> 4) + auVar18[10];
    auVar34[0xb] = (auVar18[0xb] >> 4) + auVar18[0xb];
    auVar34[0xc] = (char)(auVar20._12_2_ >> 4) + auVar20[0xc];
    auVar34[0xd] = (auVar20[0xd] >> 4) + auVar20[0xd];
    auVar34[0xe] = (char)(auVar23._14_2_ >> 4) + auVar23[0xe];
    auVar34[0xf] = (auVar23[0xf] >> 4) + auVar23[0xf];
    auVar22 = psadbw(auVar34 & _DAT_002b0070,_DAT_002a4010);
    if ((ulong)(auVar22._8_8_ + auVar22._0_8_) <= uVar11) break;
    pAVar6 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        this->sortOrders[*local_40][uVar11]);
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct((ulong)local_88,'\t');
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_88);
    local_128 = &local_118;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_118 = *plVar4;
      lStack_110 = puVar5[3];
    }
    else {
      local_118 = *plVar4;
      local_128 = (long *)*puVar5;
    }
    local_120 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_128,(ulong)(pAVar6->_name)._M_dataplus._M_p);
    local_188 = &local_178;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_178 = *puVar8;
      lStack_170 = puVar5[3];
    }
    else {
      local_178 = *puVar8;
      local_188 = (ulong *)*puVar5;
    }
    local_180 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
    local_108 = &local_f8;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_f8 = *plVar4;
      lStack_f0 = puVar5[3];
    }
    else {
      local_f8 = *plVar4;
      local_108 = (long *)*puVar5;
    }
    local_100 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_108,(ulong)(pAVar6->_name)._M_dataplus._M_p);
    local_148 = &local_138;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_138 = *plVar4;
      lStack_130 = puVar5[3];
    }
    else {
      local_138 = *plVar4;
      local_148 = (long *)*puVar5;
    }
    local_140 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
    local_168 = &local_158;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_158 = *puVar8;
      lStack_150 = puVar5[3];
    }
    else {
      local_158 = *puVar8;
      local_168 = (ulong *)*puVar5;
    }
    local_160 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct((ulong)&local_c8,'\f');
    uVar10 = 0xf;
    if (local_168 != &local_158) {
      uVar10 = local_158;
    }
    if (uVar10 < (ulong)(local_c0 + local_160)) {
      uVar10 = 0xf;
      if (local_c8 != local_b8) {
        uVar10 = local_b8[0];
      }
      if (uVar10 < (ulong)(local_c0 + local_160)) goto LAB_00223718;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_168);
    }
    else {
LAB_00223718:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_c8);
    }
    local_1c8 = &local_1b8;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_1b8 = *puVar8;
      uStack_1b0 = puVar5[3];
    }
    else {
      local_1b8 = *puVar8;
      local_1c8 = (ulong *)*puVar5;
    }
    local_1c0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    local_1e8 = &local_1d8;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_1d8 = *puVar8;
      lStack_1d0 = puVar5[3];
    }
    else {
      local_1d8 = *puVar8;
      local_1e8 = (ulong *)*puVar5;
    }
    local_1e0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_1e8,(ulong)(pAVar6->_name)._M_dataplus._M_p);
    local_1a8 = &local_198;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_198 = *plVar4;
      lStack_190 = puVar5[3];
    }
    else {
      local_198 = *plVar4;
      local_1a8 = (long *)*puVar5;
    }
    local_1a0 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
    local_208 = &local_1f8;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_1f8 = *puVar8;
      lStack_1f0 = puVar5[3];
    }
    else {
      local_1f8 = *puVar8;
      local_208 = (ulong *)*puVar5;
    }
    local_200 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_208,(ulong)(pAVar6->_name)._M_dataplus._M_p);
    local_228 = &local_218;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_218 = *puVar8;
      uStack_210 = puVar5[3];
    }
    else {
      local_218 = *puVar8;
      local_228 = (ulong *)*puVar5;
    }
    local_220 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
    local_248 = &local_238;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_238 = *plVar4;
      lStack_230 = puVar5[3];
    }
    else {
      local_238 = *plVar4;
      local_248 = (long *)*puVar5;
    }
    local_240 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_248);
    if (local_248 != &local_238) {
      operator_delete(local_248);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    uVar11 = uVar11 + 1;
  }
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,'\t');
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_1f8 = *puVar8;
    lStack_1f0 = plVar4[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar8;
    local_208 = (ulong *)*plVar4;
  }
  local_200 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1e8 = &local_1d8;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x06');
  uVar11 = 0xf;
  if (local_208 != &local_1f8) {
    uVar11 = local_1f8;
  }
  if (uVar11 < (ulong)(local_1e0 + local_200)) {
    uVar11 = 0xf;
    if (local_1e8 != &local_1d8) {
      uVar11 = local_1d8;
    }
    if (uVar11 < (ulong)(local_1e0 + local_200)) goto LAB_00223ba2;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_208);
  }
  else {
LAB_00223ba2:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1e8);
  }
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_218 = *puVar8;
    uStack_210 = puVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *puVar8;
    local_228 = (ulong *)*puVar5;
  }
  local_220 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_248 = &local_238;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_238 = *plVar7;
    lStack_230 = plVar4[3];
  }
  else {
    local_238 = *plVar7;
    local_248 = (long *)*plVar4;
  }
  local_240 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_248);
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (multifaq::cppgen::BENCH_INDIVIDUAL != '\x01') goto LAB_00224155;
  local_108 = &local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,'\x06');
  puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,0x2b2de1);
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_138 = *plVar4;
    lStack_130 = puVar5[3];
    local_148 = &local_138;
  }
  else {
    local_138 = *plVar4;
    local_148 = (long *)*puVar5;
  }
  local_140 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
  local_168 = &local_158;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_158 = *puVar8;
    lStack_150 = puVar5[3];
  }
  else {
    local_158 = *puVar8;
    local_168 = (ulong *)*puVar5;
  }
  local_160 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_1b8 = *puVar8;
    uStack_1b0 = puVar5[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar8;
    local_1c8 = (ulong *)*puVar5;
  }
  local_1c0 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_188 = &local_178;
  std::__cxx11::string::_M_construct((ulong)&local_188,'\x06');
  uVar11 = 0xf;
  if (local_1c8 != &local_1b8) {
    uVar11 = local_1b8;
  }
  if (uVar11 < (ulong)(local_180 + local_1c0)) {
    uVar11 = 0xf;
    if (local_188 != &local_178) {
      uVar11 = local_178;
    }
    if (uVar11 < (ulong)(local_180 + local_1c0)) goto LAB_00223e9f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_1c8);
  }
  else {
LAB_00223e9f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_188);
  }
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_1d8 = *puVar8;
    lStack_1d0 = puVar5[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *puVar8;
    local_1e8 = (ulong *)*puVar5;
  }
  local_1e0 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
  local_1a8 = &local_198;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_198 = *plVar4;
    lStack_190 = puVar5[3];
  }
  else {
    local_198 = *plVar4;
    local_1a8 = (long *)*puVar5;
  }
  local_1a0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_e8[0]);
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_1f8 = *puVar8;
    lStack_1f0 = puVar5[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar8;
    local_208 = (ulong *)*puVar5;
  }
  local_200 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_218 = *puVar8;
    uStack_210 = puVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *puVar8;
    local_228 = (ulong *)*puVar5;
  }
  local_220 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
  local_248 = &local_238;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_238 = *plVar4;
    lStack_230 = puVar5[3];
  }
  else {
    local_238 = *plVar4;
    local_248 = (long *)*puVar5;
  }
  local_240 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_248);
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
LAB_00224155:
  local_228 = &local_218;
  std::__cxx11::string::_M_construct((ulong)&local_228,'\x03');
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_a8);
  psVar3 = local_48;
  local_248 = &local_238;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_238 = *plVar7;
    lStack_230 = plVar4[3];
  }
  else {
    local_238 = *plVar7;
    local_248 = (long *)*plVar4;
  }
  local_240 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_248);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar9) {
    lVar2 = plVar4[3];
    (psVar3->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&psVar3->field_2 + 8) = lVar2;
  }
  else {
    (psVar3->_M_dataplus)._M_p = (pointer)*plVar4;
    (psVar3->field_2)._M_allocated_capacity = *psVar9;
  }
  psVar3->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  return psVar3;
}

Assistant:

std::string CppGenerator::genSortFunction(const size_t& rel_id)
{
    TDNode* relation = _td->getRelation(rel_id);
    std::string relName = relation->_name;

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
    std::string sortAlgo = "__gnu_parallel::sort(";
#else
    std::string sortAlgo = "std::sort(";
#endif
    
    std::string returnString = offset(1)+"void sort"+relName+"()\n"+offset(1)+"{\n";

    if (BENCH_INDIVIDUAL)
        returnString += offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count();\n\n";

    returnString += offset(2)+sortAlgo+relName+".begin(),"+
        relName+".end(),[ ](const "+relName+"_tuple& lhs, const "+relName+
        "_tuple& rhs)\n"+offset(2)+"{\n";

    // size_t orderIdx = 0;
    // for (const size_t& var : varOrder)
    // {
    //     if (baseRelation->_bag[var])
    //     {
    //         const std::string& attrName = _td->getAttribute(var)->_name;
    //         returnString += offset(3)+"if(lhs."+attrName+" != rhs."+attrName+")\n"+
    //             offset(4)+"return lhs."+attrName+" < rhs."+attrName+";\n";
    //         // Reset the relSortOrder array for future calls 
    //         sortOrders[view->_origin][orderIdx] = var;
    //         ++orderIdx;
    //     }
    // }

    for (size_t var = 0; var < relation->_bag.count(); ++var)
    {
        const std::string& attrName = _td->getAttribute(sortOrders[rel_id][var])->_name;
        returnString += offset(3)+"if(lhs."+attrName+" != rhs."+attrName+")\n"+
            offset(4)+"return lhs."+attrName+" < rhs."+attrName+";\n";
    }
    returnString += offset(3)+"return false;\n"+offset(2)+"});\n";

    if (BENCH_INDIVIDUAL)
        returnString += "\n"+offset(2)+
            "int64_t endProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
            offset(2)+"std::cout << \"Sort Relation "+relName+": \"+"+
            "std::to_string(endProcess)+\"ms.\\n\";\n\n";    
        // offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | " +
        // "std::ofstream::app);\n"+
        // offset(2)+"ofs << \"\\t\" << endProcess;\n"+
        // offset(2)+"ofs.close();\n";
    
    return returnString+offset(1)+"}\n";
}